

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.hpp
# Opt level: O2

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,status_type *S)

{
  undefined4 uVar1;
  wostream *pwVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  io_range<const_unsigned_long_*> local_30;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  pwVar2 = std::operator<<((wostream *)out,'(');
  pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,S->mti);
  pwVar2 = std::operator<<(pwVar2,' ');
  local_30.first = S->mt;
  local_30.last = (unsigned_long *)(S + 1);
  local_30.delim_str = " ";
  pbVar3 = utility::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar2,
                               &local_30);
  std::operator<<((wostream *)pbVar3,')');
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.mti << ' ' << utility::make_io_range(S.mt, S.mt + N, " ") << ')';
        out.flags(flags);
        return out;
      }